

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

double solver2_progress(sat_solver2 *s)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = s->size;
  dVar3 = (double)iVar1;
  if (iVar1 < 1) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    lVar2 = 0;
    do {
      if (s->assigns[lVar2] != '\x03') {
        dVar4 = pow(1.0 / dVar3,(double)s->levels[lVar2]);
        dVar5 = dVar5 + dVar4;
        iVar1 = s->size;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
    dVar3 = (double)iVar1;
  }
  return dVar5 / dVar3;
}

Assistant:

static double solver2_progress(sat_solver2* s)
{
    int i;
    double progress = 0.0, F = 1.0 / s->size;
    for (i = 0; i < s->size; i++)
        if (var_value(s, i) != varX)
            progress += pow(F, var_level(s, i));
    return progress / s->size;
}